

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall lumeview::Renderer::render(Renderer *this,View *view)

{
  GLfloat GVar1;
  pointer pSVar2;
  PFNGLUNIFORM1FPROC p_Var3;
  GLint GVar4;
  pointer pSVar5;
  Shader shader;
  pointer local_48;
  Renderer *local_38;
  
  prepare_buffers(this);
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glDepthFunc)(0x203);
  pSVar2 = (this->m_stages).
           super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (pSVar5 = (this->m_stages).
                super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar2; pSVar5 = pSVar5 + 1) {
    get_shader((Renderer *)&stack0xffffffffffffffb8,(GrobSet)(index_t)local_38,
               (pSVar5->grobSet).m_offset);
    View::apply(view);
    Shader::use((Shader *)&stack0xffffffffffffffb8);
    Shader::set_view((Shader *)&stack0xffffffffffffffb8,view);
    Shader::set_uniform((Shader *)&stack0xffffffffffffffb8,"color",&pSVar5->color);
    p_Var3 = glad_glUniform1f;
    GVar1 = pSVar5->zfacNear;
    GVar4 = (*glad_glGetUniformLocation)(*(GLuint *)&(local_48->name)._M_dataplus._M_p,"zfacNear");
    (*p_Var3)(GVar4,GVar1);
    p_Var3 = glad_glUniform1f;
    GVar1 = pSVar5->zfacFar;
    GVar4 = (*glad_glGetUniformLocation)(*(GLuint *)&(local_48->name)._M_dataplus._M_p,"zfacFar");
    (*p_Var3)(GVar4,GVar1);
    (*glad_glBindVertexArray)(pSVar5->vao);
    (*glad_glDrawElements)(pSVar5->primType,pSVar5->numInds,0x1405,(void *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void Renderer::
render (const View& view)
{
	prepare_buffers ();

	glEnable (GL_BLEND);
	glBlendFunc (GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	glDepthFunc(GL_LEQUAL);

	for(auto& stage : m_stages) {
		Shader shader = get_shader (stage.grobSet, stage.shadingPreset);
		view.apply ();
		shader.use ();
		shader.set_view (view);
		shader.set_uniform("color", stage.color);
		shader.set_uniform("zfacNear", stage.zfacNear);
		shader.set_uniform("zfacFar", stage.zfacFar);
		glBindVertexArray (stage.vao);
		glDrawElements (stage.primType, stage.numInds, GL_UNSIGNED_INT, 0);
	}
}